

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte *data;
  LodePNGColorMode *pLVar1;
  LodePNGColorMode *b;
  LodePNGInfo *info;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uchar uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uchar *puVar16;
  byte *chunk;
  uchar *puVar17;
  ulong uVar18;
  uint uVar19;
  size_t sVar20;
  ulong uVar21;
  size_t bytewidth;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  uchar *puVar27;
  size_t expected_size;
  size_t __size;
  uint uVar28;
  long lVar29;
  ulong local_278;
  uchar *scanlines;
  size_t local_240;
  uint passh [7];
  uint passh_1 [7];
  uint passw_1 [7];
  uint passw [7];
  size_t local_1b8 [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  *out = (uchar *)0x0;
  scanlines = (uchar *)0x0;
  local_240 = 0;
  *out = (uchar *)0x0;
  *h = 0;
  *w = 0;
  uVar12 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar12;
  if (uVar12 == 0) {
    uVar12 = *w;
    uVar2 = *h;
    if (CONCAT44(0,uVar2) * (ulong)uVar12 >> 0x3d == 0) {
      uVar13 = getNumColorChannels((state->info_png).color.colortype);
      uVar13 = uVar13 * (state->info_png).color.bitdepth;
      uVar14 = getNumColorChannels((state->info_raw).colortype);
      uVar14 = uVar14 * (state->info_raw).bitdepth;
      if (uVar14 < uVar13) {
        uVar14 = uVar13;
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (ulong)(uVar12 >> 3) * (ulong)uVar14 +
                     ((ulong)(uVar12 & 7) * (ulong)uVar14 + 7 >> 3) + 5;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = CONCAT44(0,uVar2);
      if (SUB168(auVar5 * auVar6,8) == 0) {
        puVar16 = (uchar *)malloc(insize);
        if (puVar16 == (uchar *)0x0) {
          state->error = 0x53;
          goto LAB_0010d288;
        }
        info = &state->info_png;
        pLVar1 = &(state->info_png).color;
        chunk = in + 0x21;
        iVar15 = 1;
        sVar20 = 0;
        bVar7 = false;
        do {
          if ((bVar7) || (state->error != 0)) break;
          if (insize < chunk + (0xc - (long)in) || chunk < in) {
            if ((state->decoder).ignore_end == 0) {
              state->error = 0x1e;
            }
LAB_0010d439:
            iVar26 = 3;
            bVar7 = false;
          }
          else {
            if ((int)((uint)*chunk << 0x18) < 0) {
              if ((state->decoder).ignore_end == 0) {
                state->error = 0x3f;
              }
              goto LAB_0010d439;
            }
            uVar12 = (uint)chunk[3] | (uint)chunk[1] << 0x10 | (uint)chunk[2] << 8 |
                     (uint)*chunk << 0x18;
            uVar21 = (ulong)uVar12;
            if ((insize < chunk + (0xc - (long)in) + uVar21) || (chunk + uVar21 + 0xc < in)) {
              state->error = 0x40;
              goto LAB_0010d439;
            }
            data = chunk + 8;
            uVar10 = lodepng_chunk_type_equals(chunk,"IDAT");
            if (uVar10 == '\0') {
              uVar10 = lodepng_chunk_type_equals(chunk,"IEND");
              if (uVar10 != '\0') {
                bVar7 = true;
                bVar8 = false;
                bVar9 = false;
                goto LAB_0010d497;
              }
              uVar10 = lodepng_chunk_type_equals(chunk,"PLTE");
              if (uVar10 != '\0') {
                uVar12 = readChunk_PLTE(pLVar1,data,uVar21);
                state->error = uVar12;
                iVar26 = 3;
                bVar7 = false;
                if (uVar12 == 0) {
                  iVar15 = 2;
                  goto LAB_0010d495;
                }
                goto LAB_0010d43c;
              }
              uVar10 = lodepng_chunk_type_equals(chunk,"tRNS");
              if (uVar10 == '\0') {
                uVar10 = lodepng_chunk_type_equals(chunk,"bKGD");
                if (uVar10 == '\0') {
                  uVar10 = lodepng_chunk_type_equals(chunk,"tEXt");
                  if (uVar10 == '\0') {
                    uVar10 = lodepng_chunk_type_equals(chunk,"zTXt");
                    if (uVar10 != '\0') {
                      if ((state->decoder).read_text_chunks == 0) goto LAB_0010d65b;
                      uVar12 = readChunk_zTXt(info,&state->decoder,data,uVar21);
                      goto LAB_0010d639;
                    }
                    uVar10 = lodepng_chunk_type_equals(chunk,"iTXt");
                    if (uVar10 == '\0') {
                      uVar10 = lodepng_chunk_type_equals(chunk,"tIME");
                      if (uVar10 == '\0') {
                        uVar10 = lodepng_chunk_type_equals(chunk,"pHYs");
                        if (uVar10 != '\0') {
                          uVar12 = readChunk_pHYs(info,data,uVar21);
                          goto LAB_0010d70e;
                        }
                        uVar10 = lodepng_chunk_type_equals(chunk,"gAMA");
                        if (uVar10 != '\0') {
                          if (uVar12 != 4) {
                            state->error = 0x60;
                            goto LAB_0010d729;
                          }
                          (state->info_png).gama_defined = 1;
                          uVar12 = *(uint *)(chunk + 8);
                          (state->info_png).gama_gamma =
                               uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                               uVar12 << 0x18;
LAB_0010d778:
                          state->error = 0;
                          goto LAB_0010d73b;
                        }
                        uVar10 = lodepng_chunk_type_equals(chunk,"cHRM");
                        if (uVar10 != '\0') {
                          uVar12 = readChunk_cHRM(info,data,uVar21);
                          goto LAB_0010d70e;
                        }
                        uVar10 = lodepng_chunk_type_equals(chunk,"sRGB");
                        if (uVar10 == '\0') {
                          uVar10 = lodepng_chunk_type_equals(chunk,"iCCP");
                          if (uVar10 == '\0') {
                            if (((state->decoder).ignore_critical != 0) || ((chunk[4] & 0x20) != 0))
                            {
                              if ((state->decoder).remember_unknown_chunks == 0) {
                                bVar7 = false;
                                bVar9 = true;
                                bVar8 = true;
                              }
                              else {
                                uVar12 = lodepng_chunk_append
                                                   ((state->info_png).unknown_chunks_data +
                                                    (iVar15 - 1U),
                                                    (state->info_png).unknown_chunks_size +
                                                    (iVar15 - 1U),chunk);
                                state->error = uVar12;
                                iVar26 = 3;
                                bVar7 = false;
                                bVar9 = true;
                                bVar8 = true;
                                if (uVar12 != 0) goto LAB_0010d43c;
                              }
                              goto LAB_0010d497;
                            }
                            state->error = 0x45;
                            goto LAB_0010d729;
                          }
                          uVar12 = readChunk_iCCP(info,&state->decoder,data,uVar21);
                          state->error = uVar12;
                          goto LAB_0010d718;
                        }
                        if (uVar12 == 1) {
                          (state->info_png).srgb_defined = 1;
                          (state->info_png).srgb_intent = (uint)*data;
                          goto LAB_0010d778;
                        }
                        state->error = 0x62;
                      }
                      else {
                        uVar12 = readChunk_tIME(info,data,uVar21);
LAB_0010d70e:
                        state->error = uVar12;
LAB_0010d718:
                        if (uVar12 == 0) {
LAB_0010d73b:
                          bVar8 = false;
                          bVar7 = false;
                          bVar9 = true;
                          goto LAB_0010d497;
                        }
                      }
LAB_0010d729:
                      bVar7 = false;
                      iVar26 = 3;
                      goto LAB_0010d43c;
                    }
                    if ((state->decoder).read_text_chunks != 0) {
                      uVar12 = readChunk_iTXt(info,&state->decoder,data,uVar21);
                      state->error = uVar12;
                      if (uVar12 != 0) goto LAB_0010d729;
                    }
                  }
                  else {
                    if ((state->decoder).read_text_chunks == 0) {
LAB_0010d65b:
                      bVar9 = true;
                      bVar8 = false;
                      bVar7 = false;
                      goto LAB_0010d497;
                    }
                    uVar12 = readChunk_tEXt(info,data,uVar21);
LAB_0010d639:
                    state->error = uVar12;
                    iVar26 = 3;
                    bVar7 = false;
                    if (uVar12 != 0) goto LAB_0010d43c;
                  }
                  bVar7 = false;
                  bVar8 = false;
                  bVar9 = true;
                  goto LAB_0010d497;
                }
                uVar12 = readChunk_bKGD(info,data,uVar21);
              }
              else {
                uVar12 = readChunk_tRNS(pLVar1,data,uVar21);
              }
              state->error = uVar12;
              iVar26 = 3;
              bVar7 = false;
              if (uVar12 == 0) goto LAB_0010d495;
            }
            else {
              uVar23 = sVar20 + uVar21;
              if ((CARRY8(sVar20,uVar21)) || (insize < uVar23)) {
                state->error = 0x5f;
                iVar26 = 3;
                bVar8 = false;
                uVar23 = sVar20;
              }
              else {
                iVar26 = 0;
                bVar8 = true;
                iVar15 = 3;
                if (uVar21 != 0) {
                  memcpy(puVar16 + sVar20,data,uVar21);
                  bVar8 = true;
                }
              }
              sVar20 = uVar23;
              bVar7 = false;
              if (bVar8) {
LAB_0010d495:
                bVar7 = false;
                bVar9 = true;
                bVar8 = false;
LAB_0010d497:
                if (((bVar8) || ((state->decoder).ignore_crc != 0)) ||
                   (uVar12 = lodepng_chunk_check_crc(chunk), uVar12 == 0)) {
                  iVar26 = 0;
                  if (bVar9) {
                    chunk = lodepng_chunk_next_const(chunk,in + insize);
                  }
                }
                else {
                  state->error = 0x39;
                  iVar26 = 3;
                }
              }
            }
          }
LAB_0010d43c:
        } while (iVar26 == 0);
        if (((state->error == 0) && (pLVar1->colortype == LCT_PALETTE)) &&
           ((state->info_png).color.palette == (uchar *)0x0)) {
          state->error = 0x6a;
        }
        if (state->error == 0) {
          uVar12 = (state->info_png).interlace_method;
          uVar2 = (state->info_png).color.bitdepth;
          uVar14 = getNumColorChannels((state->info_png).color.colortype);
          uVar14 = uVar14 * uVar2;
          uVar2 = *w;
          uVar21 = (ulong)uVar14;
          if (uVar12 == 0) {
            expected_size =
                 (uVar21 * (uVar2 >> 3) + (ulong)((uVar2 & 7) * uVar14 + 7 >> 3) + 1) * (ulong)*h;
          }
          else {
            uVar12 = *h;
            lVar29 = (uVar2 + 7 >> 6) * uVar21 + (ulong)((uVar2 + 7 >> 3 & 7) * uVar14 + 7 >> 3) + 1
            ;
            if (4 < uVar2) {
              lVar29 = lVar29 + (ulong)((uVar2 + 3 >> 3 & 7) * uVar14 + 7 >> 3) +
                                (uVar2 + 3 >> 6) * uVar21 + 1;
            }
            lVar29 = (ulong)(uVar12 + 3 >> 3) *
                     ((uVar2 + 3 >> 5) * uVar21 + (ulong)((uVar2 + 3 >> 2 & 7) * uVar14 + 7 >> 3) +
                     1) + lVar29 * (ulong)(uVar12 + 7 >> 3);
            if (2 < uVar2) {
              lVar29 = lVar29 + (ulong)(uVar12 + 3 >> 2) *
                                ((ulong)((uVar2 + 1 >> 2 & 7) * uVar14 + 7 >> 3) +
                                 (uVar2 + 1 >> 5) * uVar21 + 1);
            }
            lVar29 = (ulong)(uVar12 + 1 >> 2) *
                     ((uVar2 + 1 >> 4) * uVar21 + (ulong)((uVar2 + 1 >> 1 & 7) * uVar14 + 7 >> 3) +
                     1) + lVar29;
            if (1 < uVar2) {
              lVar29 = lVar29 + (ulong)(uVar12 + 1 >> 1) *
                                ((ulong)((uVar2 >> 1 & 7) * uVar14 + 7 >> 3) + (uVar2 >> 4) * uVar21
                                + 1);
            }
            expected_size =
                 ((uVar2 >> 3) * uVar21 + (ulong)((uVar2 & 7) * uVar14 + 7 >> 3) + 1) *
                 (ulong)(uVar12 >> 1) + lVar29;
          }
          uVar12 = zlib_decompress(&scanlines,&local_240,expected_size,puVar16,sVar20,
                                   (LodePNGDecompressSettings *)state);
          state->error = uVar12;
        }
        else {
          expected_size = 0;
        }
        if ((state->error == 0) && (local_240 != expected_size)) {
          state->error = 0x5b;
        }
        free(puVar16);
        if (state->error == 0) {
          uVar12 = *w;
          uVar2 = *h;
          uVar14 = (state->info_png).color.bitdepth;
          uVar13 = getNumColorChannels((state->info_png).color.colortype);
          uVar21 = (ulong)(uVar13 * uVar14);
          __size = (((uint)((ulong)uVar2 * (ulong)uVar12) & 7) * uVar21 + 7 >> 3) +
                   ((ulong)uVar2 * (ulong)uVar12 >> 3) * uVar21;
          puVar16 = (uchar *)malloc(__size);
          *out = puVar16;
          if (puVar16 == (uchar *)0x0) {
            state->error = 0x53;
          }
        }
        else {
          __size = 0;
        }
        if (state->error == 0) {
          if (__size != 0) {
            memset(*out,0,__size);
          }
          puVar17 = scanlines;
          puVar16 = *out;
          uVar12 = *w;
          uVar2 = *h;
          uVar14 = (state->info_png).color.bitdepth;
          uVar13 = getNumColorChannels((state->info_png).color.colortype);
          uVar13 = uVar13 * uVar14;
          if (uVar13 == 0) {
            uVar14 = 0x1f;
          }
          else if ((state->info_png).interlace_method == 0) {
            if (uVar13 < 8) {
              uVar19 = uVar13 * uVar12;
              uVar28 = uVar19 + 7 & 0xfffffff8;
              if (uVar19 == uVar28) goto LAB_0010ddae;
              uVar14 = unfilter(puVar17,puVar17,uVar12,uVar2,uVar13);
              if (uVar14 != 0) goto LAB_0010e10a;
              removePaddingBits(puVar16,puVar17,(ulong)uVar19,(ulong)uVar28,uVar2);
            }
            else {
LAB_0010ddae:
              uVar14 = unfilter(puVar16,puVar17,uVar12,uVar2,uVar13);
              if (uVar14 != 0) goto LAB_0010e10a;
            }
LAB_0010e104:
            uVar14 = 0;
          }
          else {
            Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar12,uVar2
                                ,uVar13);
            puVar27 = puVar17 + padded_passstart[0];
            uVar14 = unfilter(puVar27,puVar17 + filter_passstart[0],passw[0],passh[0],uVar13);
            if (uVar14 == 0) {
              lVar29 = 0;
              uVar19 = passw[0];
              uVar28 = passh[0];
              do {
                if (uVar13 < 8) {
                  removePaddingBits(puVar17 + *(long *)((long)local_178 + lVar29 * 2),puVar27,
                                    (ulong)(uVar19 * uVar13),
                                    (ulong)(uVar19 * uVar13 + 7 & 0xfffffff8),uVar28);
                }
                if (lVar29 == 0x18) {
                  Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,
                                      local_1b8,uVar12,uVar2,uVar13);
                  if (uVar13 < 8) {
                    lVar29 = 0;
                    do {
                      uVar2 = passh_1[lVar29];
                      if ((ulong)uVar2 != 0) {
                        uVar14 = passw_1[lVar29];
                        local_278 = 0;
                        do {
                          if ((ulong)uVar14 != 0) {
                            sVar20 = local_1b8[lVar29];
                            uVar19 = ADAM7_IY[lVar29];
                            uVar28 = ADAM7_DY[lVar29];
                            uVar3 = ADAM7_IX[lVar29];
                            uVar4 = ADAM7_DX[lVar29];
                            uVar21 = 0;
                            do {
                              uVar25 = (uVar21 * uVar4 + (ulong)uVar3) * (ulong)uVar13 +
                                       (uVar28 * local_278 + (ulong)uVar19) *
                                       (ulong)(uVar12 * uVar13);
                              uVar18 = (ulong)(((int)local_278 * uVar14 + (int)uVar21) * uVar13) +
                                       sVar20 * 8;
                              uVar23 = (ulong)uVar13;
                              do {
                                bVar11 = '\x01' << (~(byte)uVar25 & 7);
                                if ((puVar17[uVar18 >> 3] >> (~(byte)uVar18 & 7) & 1) == 0) {
                                  puVar16[uVar25 >> 3] = puVar16[uVar25 >> 3] & ~bVar11;
                                }
                                else {
                                  puVar16[uVar25 >> 3] = puVar16[uVar25 >> 3] | bVar11;
                                }
                                uVar25 = uVar25 + 1;
                                uVar18 = uVar18 + 1;
                                uVar22 = (int)uVar23 - 1;
                                uVar23 = (ulong)uVar22;
                              } while (uVar22 != 0);
                              uVar21 = uVar21 + 1;
                            } while (uVar21 != uVar14);
                          }
                          local_278 = local_278 + 1;
                        } while (local_278 != uVar2);
                      }
                      lVar29 = lVar29 + 1;
                    } while (lVar29 != 7);
                  }
                  else {
                    uVar21 = (ulong)(uVar13 >> 3);
                    lVar29 = 0;
                    do {
                      uVar2 = passh_1[lVar29];
                      if ((ulong)uVar2 != 0) {
                        uVar14 = passw_1[lVar29];
                        uVar23 = 0;
                        uVar25 = 0;
                        do {
                          iVar15 = (int)uVar23;
                          if ((ulong)uVar14 != 0) {
                            uVar13 = ADAM7_DX[lVar29];
                            puVar27 = puVar16 + ((ADAM7_DY[lVar29] * uVar25 +
                                                 (ulong)ADAM7_IY[lVar29]) * (ulong)uVar12 +
                                                (ulong)ADAM7_IX[lVar29]) * uVar21;
                            sVar20 = local_1b8[lVar29];
                            uVar18 = 0;
                            do {
                              uVar24 = 0;
                              do {
                                puVar27[uVar24] = puVar17[uVar24 + uVar23 * uVar21 + sVar20];
                                uVar24 = uVar24 + 1;
                              } while (uVar21 != uVar24);
                              uVar18 = uVar18 + 1;
                              puVar27 = puVar27 + uVar13 * uVar21;
                              uVar23 = (ulong)((int)uVar23 + 1);
                            } while (uVar18 != uVar14);
                          }
                          uVar25 = uVar25 + 1;
                          uVar23 = (ulong)(iVar15 + uVar14);
                        } while (uVar25 != uVar2);
                      }
                      lVar29 = lVar29 + 1;
                    } while (lVar29 != 7);
                  }
                  goto LAB_0010e104;
                }
                puVar27 = puVar17 + *(long *)((long)padded_passstart + lVar29 * 2 + 8);
                uVar19 = *(uint *)((long)passw + lVar29 + 4);
                uVar28 = *(uint *)((long)passh + lVar29 + 4);
                uVar14 = unfilter(puVar27,puVar17 + *(long *)((long)filter_passstart +
                                                             lVar29 * 2 + 8),uVar19,uVar28,uVar13);
                lVar29 = lVar29 + 4;
              } while (uVar14 == 0);
            }
          }
LAB_0010e10a:
          state->error = uVar14;
        }
        free(scanlines);
        goto LAB_0010d288;
      }
    }
    state->error = 0x5c;
  }
LAB_0010d288:
  if (state->error != 0) {
    return state->error;
  }
  uVar12 = (state->decoder).color_convert;
  if (uVar12 != 0) {
    pLVar1 = &state->info_raw;
    b = &(state->info_png).color;
    iVar15 = lodepng_color_mode_equal(pLVar1,b);
    if (iVar15 == 0) {
      puVar16 = *out;
      if (((pLVar1->colortype | LCT_GREY_ALPHA) != LCT_RGBA) && ((state->info_raw).bitdepth != 8)) {
        return 0x38;
      }
      uVar12 = *w;
      uVar2 = *h;
      uVar14 = (state->info_raw).bitdepth;
      uVar13 = getNumColorChannels(pLVar1->colortype);
      uVar21 = (ulong)(uVar14 * uVar13);
      uVar23 = (ulong)uVar2 * (ulong)uVar12;
      puVar17 = (uchar *)malloc((((uint)uVar23 & 7) * uVar21 + 7 >> 3) + (uVar23 >> 3) * uVar21);
      *out = puVar17;
      if (puVar17 == (uchar *)0x0) {
        uVar12 = 0x53;
      }
      else {
        uVar12 = lodepng_convert(puVar17,puVar16,pLVar1,b,uVar12,uVar2);
      }
      state->error = uVar12;
      free(puVar16);
      goto LAB_0010d9f6;
    }
    if (uVar12 != 0) goto LAB_0010d9f6;
  }
  uVar12 = lodepng_color_mode_copy(&state->info_raw,&(state->info_png).color);
  state->error = uVar12;
  if (uVar12 != 0) {
    return uVar12;
  }
LAB_0010d9f6:
  return state->error;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize) {
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color)) {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert) {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  } else { /*color conversion needed*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from grayscale input color type, to 8-bit grayscale or grayscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8)) {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out)) {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}